

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.c
# Opt level: O1

utf8proc_int32_t utf8proc_tolower(utf8proc_int32_t c)

{
  utf8proc_property_t *puVar1;
  ulong uVar2;
  
  if ((uint)c < 0x110000) {
    puVar1 = utf8proc_properties +
             utf8proc_stage2table[(c & 0xffU) + (uint)utf8proc_stage1table[(uint)c >> 8]];
  }
  else {
    puVar1 = utf8proc_properties;
  }
  uVar2 = (ulong)puVar1->lowercase_seqindex;
  if ((uVar2 != 0xffff) &&
     (c = (utf8proc_int32_t)utf8proc_sequences[uVar2], (c & 0xf800U) == 0xd800)) {
    c = (c & 0x3ffU) * 0x400 + (utf8proc_sequences[uVar2 + 1] & 0x3ff) + 0x10000;
  }
  return c;
}

Assistant:

UTF8PROC_DLLEXPORT utf8proc_int32_t utf8proc_tolower(utf8proc_int32_t c)
{
  utf8proc_int32_t cl = utf8proc_get_property(c)->lowercase_seqindex;
  return cl != UINT16_MAX ? seqindex_decode_index(cl) : c;
}